

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O2

void Abc_SclLoad(SC_Lib *pLib,SC_Lib **ppScl)

{
  if (*ppScl != (SC_Lib *)0x0) {
    Abc_SclLibFree(*ppScl);
    *ppScl = (SC_Lib *)0x0;
  }
  if (pLib != (SC_Lib *)0x0) {
    *ppScl = pLib;
  }
  return;
}

Assistant:

void Abc_SclLoad( SC_Lib * pLib, SC_Lib ** ppScl )
{
    if ( *ppScl )
    {
        Abc_SclLibFree( *ppScl );
        *ppScl = NULL;
    }
    assert( *ppScl == NULL );
    if ( pLib )
        *(SC_Lib **)ppScl = pLib;
}